

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::FillSortedGlobalDictMap
          (DictionaryPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *sorted_global_dict)

{
  int iVar1;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var2;
  uint uVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  ReaderMutexLock ml;
  TemplateString key;
  ReaderMutexLock local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  key_type local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  TemplateString local_50;
  
  local_a0.mu_ = (Mutex *)g_static_mutex;
  local_98 = sorted_global_dict;
  if ((g_static_mutex[0x38] == '\x01') &&
     (iVar1 = pthread_rwlock_rdlock((pthread_rwlock_t *)g_static_mutex), iVar1 != 0)) {
    abort();
  }
  uVar3 = *global_dict_;
  p_Var2 = (_Rb_tree_node_base *)0x0;
  if ((int)uVar3 < 0) {
    p_Var2 = *(_Rb_tree_node_base **)(global_dict_ + 8);
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var5 = (_Rb_tree_node_base *)(global_dict_ + 2);
  }
  do {
    if (p_Var5 == (_Rb_tree_node_base *)0x0) {
      if (p_Var2 == (_Rb_tree_node_base *)(global_dict_ + 4) && (int)uVar3 < 0) goto LAB_001277eb;
    }
    else {
      p_Var4 = (_Rb_tree_node_base *)0x0;
      if (-1 < (int)uVar3) {
        p_Var4 = (_Rb_tree_node_base *)(global_dict_ + (ulong)uVar3 * 10 + 2);
      }
      if (p_Var5 == p_Var4) {
LAB_001277eb:
        ReaderMutexLock::~ReaderMutexLock(&local_a0);
        return;
      }
    }
    p_Var4 = p_Var2 + 1;
    if (p_Var5 != (_Rb_tree_node_base *)0x0) {
      p_Var4 = p_Var5;
    }
    TemplateString::IdToString(&local_50,*(TemplateId *)p_Var4);
    if (local_50.ptr_ == (char *)0x0) {
      __assert_fail("!InvalidTemplateString(key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x2d6,
                    "void ctemplate::TemplateDictionary::DictionaryPrinter::FillSortedGlobalDictMap(map<string, string> *)"
                   );
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,p_Var4->_M_parent,
               (long)&p_Var4->_M_parent->_M_color + (long)&p_Var4->_M_left->_M_color);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,local_50.ptr_,local_50.ptr_ + local_50.length_);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](local_98,&local_90);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (p_Var5 == (_Rb_tree_node_base *)0x0) {
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var5 = (_Rb_tree_node_base *)&p_Var5[1]._M_parent;
    }
    uVar3 = *global_dict_;
  } while( true );
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
      ReaderMutexLock ml(&g_static_mutex);
      for (GlobalDict::const_iterator it = global_dict_->begin();
           it != global_dict_->end(); ++it) {
        const TemplateString key = TemplateDictionary::IdToString(it->first);
        assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
        (*sorted_global_dict)[PrintableTemplateString(key)] =
            PrintableTemplateString(it->second);
      }
  }